

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg,upb_StringView key,
               protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *val,upb_Arena *a)

{
  upb_MapInsertStatus uVar1;
  upb_Map *map;
  protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage *val_local;
  upb_MiniTableField field;
  upb_StringView key_local;
  
  key_local.size = key.size;
  key_local.data = key.data;
  field.number_dont_copy_me__upb_internal_use_only = 0x47;
  field.offset_dont_copy_me__upb_internal_use_only = 0x270;
  field.presence = 0;
  field.submsg_index_dont_copy_me__upb_internal_use_only = 0x14;
  field.descriptortype_dont_copy_me__upb_internal_use_only = '\v';
  field.mode_dont_copy_me__upb_internal_use_only = 0xc0;
  val_local = val;
  map = _upb_Message_GetOrCreateMutableMap
                  (&msg->base_dont_copy_me__upb_internal_use_only,&field,0,8,a);
  uVar1 = _upb_Map_Insert(map,&key_local,0,&val_local,8,a);
  return uVar1 != kUpb_MapInsertStatus_OutOfMemory;
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_map_string_nested_message_set(protobuf_test_messages_proto2_TestAllTypesProto2* msg, upb_StringView key, protobuf_test_messages_proto2_TestAllTypesProto2_NestedMessage* val, upb_Arena* a) {
  const upb_MiniTableField field = {71, UPB_SIZE(208, 624), 0, 20, 11, (int)kUpb_FieldMode_Map | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__MapStringNestedMessageEntry_msg_init);
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&protobuf_0test_0messages__proto2__TestAllTypesProto2__NestedMessage_msg_init);
  upb_Map* map = _upb_Message_GetOrCreateMutableMap(UPB_UPCAST(msg),
                                                    &field, 0, sizeof(val), a);
  return _upb_Map_Insert(map, &key, 0, &val, sizeof(val), a) !=
         kUpb_MapInsertStatus_OutOfMemory;
}